

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>
::operator()(BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Times<short,_short,_short>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  View<short,_false,_std::allocator<unsigned_long>_> *pVVar1;
  pointer psVar2;
  pointer psVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  runtime_error *this_00;
  
  pVVar1 = this->e1_;
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
  psVar2 = pVVar1->data_;
  if ((psVar2 == (pointer)0x0) || ((pVVar1->geometry_).dimension_ != 3)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::strides(pVVar1,0);
    sVar5 = View<short,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
                      (pVVar1,3,c1,c2);
    pVVar1 = this->e2_;
    View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
    psVar3 = pVVar1->data_;
    if ((psVar3 != (pointer)0x0) && ((pVVar1->geometry_).dimension_ == 3)) {
      sVar6 = View<short,_false,_std::allocator<unsigned_long>_>::strides(pVVar1,0);
      sVar7 = View<short,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
                        (pVVar1,3,c1,c2);
      return psVar3[sVar6 * c0 + sVar7] * psVar2[sVar4 * c0 + sVar5];
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(e1_(c0, c1, c2), e2_(c0, c1, c2)); }